

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifund(bifcxdef *ctx,int argc)

{
  uchar *puVar1;
  errcxdef *ctx_00;
  mcmcxdef *mctx;
  objucxdef *undoctx;
  dattyp typ;
  runsdef val;
  undefined1 local_160 [112];
  __jmp_buf_tag local_f0;
  
  ctx_00 = ctx->bifcxerr;
  mctx = ctx->bifcxrun->runcxmem;
  undoctx = ctx->bifcxrun->runcxvoc->voccxundo;
  local_160._8_4_ = _setjmp(&local_f0);
  if (local_160._8_4_ == 0) {
    local_160._0_8_ = ctx_00->errcxptr;
    ctx_00->errcxptr = (errdef *)local_160;
    if (undoctx == (objucxdef *)0x0) {
      typ = 5;
    }
    else {
      objundo(mctx,undoctx);
      typ = 8;
    }
    ctx_00->errcxptr = (errdef *)local_160._0_8_;
  }
  else {
    ctx_00->errcxptr = (errdef *)local_160._0_8_;
    typ = 5;
    if (1 < local_160._8_4_ - 0xc9) {
      errrse1(ctx_00,(errdef *)local_160);
    }
  }
  runpush(ctx->bifcxrun,typ,(runsdef *)local_160);
  puVar1 = &ctx->bifcxrun->runcxvoc->voccxflg;
  *puVar1 = *puVar1 | 1;
  return;
}

Assistant:

void bifund(bifcxdef *ctx, int argc)
{
    objucxdef *ucx = ctx->bifcxrun->runcxvoc->voccxundo;
    mcmcxdef  *mcx = ctx->bifcxrun->runcxmem;
    errcxdef  *ec  = ctx->bifcxerr;
    int        err;
    int        undone;
    runsdef    val;

    bifcntargs(ctx, 0, argc);                               /* no arguments */

    ERRBEGIN(ec)
        if (ucx)
        {
            objundo(mcx, ucx);         /* try to undo to previous savepoint */
            undone = TRUE;                       /* looks like we succeeded */
        }
        else
            undone = FALSE;                  /* no undo context; can't undo */
    ERRCATCH(ec, err)
        if (err == ERR_NOUNDO || err == ERR_ICUNDO)
            undone = FALSE;
        else
            errrse(ec);            /* don't know how to handle other errors */
    ERREND(ec)

    /* return a value indicating whether the undo operation succeeded */
    runpush(ctx->bifcxrun, runclog(undone), &val);

    /* note that the rest of the command line is to be ignored */
    ctx->bifcxrun->runcxvoc->voccxflg |= VOCCXFCLEAR;
}